

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

Vertex * __thiscall Graph::greedyCapacitorAllocation(Graph *this)

{
  double dVar1;
  Edge *local_38;
  Edge *e;
  double criteria;
  Edge *edgeChoice;
  Vertex *vertex;
  double tol;
  Graph *this_local;
  
  edgeChoice = (Edge *)this->verticesList;
  while( true ) {
    if (edgeChoice == (Edge *)0x0) {
      return (Vertex *)0x0;
    }
    criteria = (double)Vertex::getEdgesList((Vertex *)edgeChoice);
    e = (Edge *)Edge::getReactivePowerFlow((Edge *)criteria);
    for (local_38 = Edge::getNext((Edge *)criteria); local_38 != (Edge *)0x0;
        local_38 = Edge::getNext(local_38)) {
      dVar1 = Edge::getReactivePowerFlow(local_38);
      if ((double)e < dVar1) {
        criteria = (double)local_38;
        e = (Edge *)Edge::getReactivePowerFlow(local_38);
      }
    }
    if (ABS((double)e) < 1e-07) break;
    edgeChoice = (Edge *)Edge::getDestiny((Edge *)criteria);
  }
  return (Vertex *)edgeChoice;
}

Assistant:

Vertex *Graph::greedyCapacitorAllocation(){
    double tol = 1e-7;
    Vertex *vertex = this->verticesList;
    while(vertex != NULL){
//        cout << endl << " Origin  Vertex #" << vertex->getID() << endl << " Destinations |";
        Edge *edgeChoice = vertex->getEdgesList();
        double criteria = edgeChoice->getReactivePowerFlow();
//        cout << " Vertex #" << edgeChoice->getDestiny()->getID() << ": " << edgeChoice->getReactivePowerFlow() << "\t|";
        for( Edge *e = edgeChoice->getNext(); e != NULL; e = e->getNext()) {
//            cout << " Vertex #" << e->getDestiny()->getID() << ": " << e->getReactivePowerFlow() << "\t|";
            if( (criteria) < (e->getReactivePowerFlow()) ){
                edgeChoice = e;
                criteria = edgeChoice->getReactivePowerFlow();
            }

        }
//        cout << endl << " BEST #" << edgeChoice->getDestiny()->getID() << ":    " << edgeChoice->getReactivePowerFlow() << endl;
        if( fabs(criteria) < tol) break;
        vertex = edgeChoice->getDestiny();
    }
//    cout <<  "              ALLOCATION VERTEX #" << vertex->getID() << endl;
    return vertex;
}